

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::Q3BSPFileImporter::createMaterials
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,aiScene *pScene,ZipArchiveIOSystem *pArchive)

{
  char cVar1;
  pointer __src;
  char *pcVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  int textureId;
  aiMaterial **ppaVar5;
  aiMaterial *this_00;
  long lVar6;
  Logger *this_01;
  _Base_ptr p_Var7;
  ulong uVar8;
  aiTexture **__dest;
  aiScene *paVar9;
  size_t __n;
  _Rb_tree_node_base *p_Var10;
  aiScene *paVar11;
  _Alloc_hider _Var12;
  string tmp1;
  string texName;
  string matName;
  string tmp;
  aiString aiMatName;
  char local_4e2 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  aiMaterial *local_4c0;
  Q3BSPModel *local_4b8;
  int local_4ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 *local_488;
  ulong local_480;
  undefined1 local_478 [16];
  char *local_468;
  long local_460;
  char local_458 [16];
  ZipArchiveIOSystem *local_448;
  _Rb_tree_node_base *local_440;
  aiString local_434;
  
  uVar8 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar8 != 0) {
    local_4b8 = pModel;
    local_448 = pArchive;
    ppaVar5 = (aiMaterial **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    pScene->mMaterials = ppaVar5;
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    p_Var7 = (this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(this->m_MaterialLookupMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = p_Var10;
    if (p_Var7 != p_Var10) {
      do {
        local_440 = p_Var3;
        local_488 = local_478;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_488,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        uVar8 = local_480;
        if (local_480 != 0) {
          if (local_480 < 0x400) {
            local_434.length = (ai_uint32)local_480;
            memcpy(local_434.data,local_488,local_480);
            local_434.data[uVar8] = '\0';
          }
          this_00 = (aiMaterial *)operator_new(0x10);
          local_4c0 = this_00;
          aiMaterial::aiMaterial(this_00);
          aiMaterial::AddProperty(this_00,&local_434,"?mat.name",0,0);
          if ((local_480 != 0) &&
             (lVar6 = std::__cxx11::string::find((char *)&local_488,0x6b557e,0), lVar6 != -1)) {
            std::__cxx11::string::substr((ulong)&local_4e0,(ulong)&local_488);
            std::__cxx11::string::substr((ulong)&local_468,(ulong)&local_488);
            _Var12._M_p = local_4e0._M_dataplus._M_p;
            textureId = atoi(local_4e0._M_dataplus._M_p);
            pcVar2 = local_468;
            local_4ac = atoi(local_468);
            if (pcVar2 != local_458) {
              operator_delete(pcVar2);
              _Var12._M_p = local_4e0._M_dataplus._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var12._M_p != &local_4e0.field_2) {
              operator_delete(_Var12._M_p);
            }
            p_Var10 = local_440;
            if ((textureId != -1) &&
               ((local_4b8->m_Textures).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start[textureId] != (sQ3BSPTexture *)0x0)) {
              local_468 = local_458;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"*","");
              local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
              std::__cxx11::string::append((char *)&local_468);
              std::__cxx11::string::append((char *)&local_468);
              paVar9 = (aiScene *)0x6acbf4;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_4a8,0,(char *)local_4a8._M_string_length,0x6acbf4);
              if (local_460 != 0) {
                local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
                local_4e0.field_2._M_allocated_capacity._0_2_ = 0x2f;
                local_4e0._M_string_length = 1;
                local_4e2[0] = '/';
                local_4e2[1] = '\\';
                std::__cxx11::string::_M_assign((string *)&local_4a8);
                lVar6 = 0;
                paVar9 = (aiScene *)local_4a8._M_string_length;
                do {
                  if (paVar9 == (aiScene *)0x0) {
                    paVar9 = (aiScene *)0x0;
                  }
                  else {
                    cVar1 = local_4e2[lVar6];
                    paVar11 = (aiScene *)0x0;
                    do {
                      if (local_4a8._M_dataplus._M_p[(long)paVar11] == cVar1) {
                        local_4a8._M_dataplus._M_p[(long)paVar11] = *local_4e0._M_dataplus._M_p;
                      }
                      paVar11 = (aiScene *)((long)&paVar11->mFlags + 1);
                      paVar9 = (aiScene *)local_4a8._M_string_length;
                    } while (paVar11 < local_4a8._M_string_length);
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 2);
                paVar9 = (aiScene *)local_4a8._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                  operator_delete(local_4e0._M_dataplus._M_p);
                }
              }
              bVar4 = importTextureFromArchive(this,local_4b8,local_448,paVar9,local_4c0,textureId);
              if (!bVar4) {
                this_01 = DefaultLogger::get();
                std::operator+(&local_4e0,"Cannot import texture from archive ",&local_4a8);
                Logger::error(this_01,local_4e0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
                  operator_delete(local_4e0._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
                operator_delete(local_4a8._M_dataplus._M_p);
              }
              if (local_468 != local_458) {
                operator_delete(local_468);
              }
            }
            if (local_4ac != -1) {
              importLightmap(this,local_4b8,pScene,local_4c0,local_4ac);
            }
          }
          pScene->mMaterials[pScene->mNumMaterials] = local_4c0;
          pScene->mNumMaterials = pScene->mNumMaterials + 1;
        }
        if (local_488 != local_478) {
          operator_delete(local_488);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        p_Var3 = local_440;
      } while (p_Var7 != p_Var10);
    }
    uVar8 = (long)(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pScene->mNumTextures = (uint)(uVar8 >> 3);
    __dest = (aiTexture **)operator_new__(uVar8 & 0x7fffffff8);
    pScene->mTextures = __dest;
    __src = (this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    __n = (long)(this->mTextures).super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__dest,__src,__n);
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createMaterials( const Q3BSP::Q3BSPModel *pModel, aiScene* pScene,
    ZipArchiveIOSystem *pArchive ) {
    if ( m_MaterialLookupMap.empty() ) {
        return;
    }

    pScene->mMaterials = new aiMaterial*[ m_MaterialLookupMap.size() ];
    aiString aiMatName;
    int textureId( -1 ), lightmapId( -1 );
    for ( FaceMapIt it = m_MaterialLookupMap.begin(); it != m_MaterialLookupMap.end();
        ++it ) {
        const std::string matName( it->first );
        if ( matName.empty() ) {
            continue;
        }

        aiMatName.Set( matName );
        aiMaterial *pMatHelper = new aiMaterial;
        pMatHelper->AddProperty( &aiMatName, AI_MATKEY_NAME );

        extractIds( matName, textureId, lightmapId );

        // Adding the texture
        if ( -1 != textureId ) {
            sQ3BSPTexture *pTexture = pModel->m_Textures[ textureId ];
            if ( nullptr != pTexture ) {
                std::string tmp( "*" ), texName( "" );
                tmp += pTexture->strName;
                tmp += ".jpg";
                normalizePathName( tmp, texName );

                if ( !importTextureFromArchive( pModel, pArchive, pScene, pMatHelper, textureId ) ) {
                    ASSIMP_LOG_ERROR("Cannot import texture from archive " + texName);
                }
            }

        }
        if ( -1 != lightmapId )
        {
            importLightmap( pModel, pScene, pMatHelper, lightmapId );
        }
        pScene->mMaterials[ pScene->mNumMaterials ] = pMatHelper;
        pScene->mNumMaterials++;
    }
    pScene->mNumTextures = static_cast<unsigned int>(mTextures.size());
    pScene->mTextures = new aiTexture*[ pScene->mNumTextures ];
    std::copy( mTextures.begin(), mTextures.end(), pScene->mTextures );
}